

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::finalCheck(TIntermediate *this,TInfoSink *infoSink,bool keepUncalled)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  EShSource EVar4;
  int iVar5;
  TIntermNode *pTVar6;
  size_type sVar7;
  reference pvVar8;
  TInfoSinkBase *pTVar9;
  TBuiltInResource *pTVar10;
  bool local_491;
  bool local_48f;
  bool local_48d;
  bool local_48b;
  bool local_489;
  bool local_420;
  bool local_41e;
  bool local_41d;
  bool local_41b;
  bool local_419;
  undefined1 local_410 [8];
  TFinalLinkTraverser finalLinkTraverser;
  pool_allocator<char> local_3d0;
  TString local_3c8;
  pool_allocator<char> local_3a0;
  TString local_398;
  byte local_369;
  pool_allocator<char> local_368;
  TString local_360;
  pool_allocator<char> local_338;
  TString local_330;
  byte local_301;
  pool_allocator<char> local_300;
  TString local_2f8;
  pool_allocator<char> local_2d0;
  TString local_2c8;
  byte local_299;
  pool_allocator<char> local_298;
  TString local_290;
  pool_allocator<char> local_268;
  TString local_260;
  byte local_231;
  pool_allocator<char> local_230;
  TString local_228;
  pool_allocator<char> local_200;
  TString local_1f8;
  ulong local_1d0;
  size_t b;
  pool_allocator<char> local_1c0;
  TString local_1b8;
  pool_allocator<char> local_190;
  TString local_188;
  byte local_159;
  pool_allocator<char> local_158;
  TString local_150;
  byte local_121;
  pool_allocator<char> local_120;
  TString local_118;
  byte local_e9;
  pool_allocator<char> local_e8;
  TString local_e0;
  pool_allocator<char> local_b8;
  TString local_b0;
  byte local_81;
  pool_allocator<char> local_80;
  TString local_78;
  pool_allocator<char> local_50;
  TString local_48;
  byte local_19;
  TInfoSink *pTStack_18;
  bool keepUncalled_local;
  TInfoSink *infoSink_local;
  TIntermediate *this_local;
  
  local_19 = keepUncalled;
  pTStack_18 = infoSink;
  infoSink_local = (TInfoSink *)this;
  pTVar6 = getTreeRoot(this);
  if (pTVar6 != (TIntermNode *)0x0) {
    if (this->numEntryPoints < 1) {
      EVar4 = getSource(this);
      if (EVar4 == EShSourceGlsl) {
        error(this,pTStack_18,"Missing entry point: Each stage requires one entry point",
              EShLangCount);
      }
      else {
        warn(this,pTStack_18,"Entry point not found",EShLangCount);
      }
    }
    checkCallGraphCycles(this,pTStack_18);
    checkCallGraphBodies(this,pTStack_18,(bool)(local_19 & 1));
    inOutLocationCheck(this,pTStack_18);
    iVar5 = getNumPushConstants(this);
    if (1 < iVar5) {
      error(this,pTStack_18,"Only one push_constant block is allowed per stage",EShLangCount);
    }
    if (this->invocations == -1) {
      this->invocations = 1;
    }
    pool_allocator<char>::pool_allocator(&local_50);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_48,
               "gl_ClipDistance",&local_50);
    bVar3 = inIoAccessed(this,&local_48);
    local_81 = 0;
    local_419 = false;
    if (bVar3) {
      pool_allocator<char>::pool_allocator(&local_80);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_78,"gl_ClipVertex",&local_80);
      local_81 = 1;
      local_419 = inIoAccessed(this,&local_78);
    }
    if ((local_81 & 1) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_78);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_48);
    if (local_419 != false) {
      error(this,pTStack_18,
            "Can only use one of gl_ClipDistance or gl_ClipVertex (gl_ClipDistance is preferred)",
            EShLangCount);
    }
    pool_allocator<char>::pool_allocator(&local_b8);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_b0,
               "gl_CullDistance",&local_b8);
    bVar3 = inIoAccessed(this,&local_b0);
    local_e9 = 0;
    local_41b = false;
    if (bVar3) {
      pool_allocator<char>::pool_allocator(&local_e8);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_e0,"gl_ClipVertex",&local_e8);
      local_e9 = 1;
      local_41b = inIoAccessed(this,&local_e0);
    }
    if ((local_e9 & 1) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_e0);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_b0);
    if (local_41b != false) {
      error(this,pTStack_18,
            "Can only use one of gl_CullDistance or gl_ClipVertex (gl_ClipDistance is preferred)",
            EShLangCount);
    }
    bVar3 = userOutputUsed(this);
    local_121 = 0;
    local_159 = 0;
    local_41d = false;
    if (bVar3) {
      pool_allocator<char>::pool_allocator(&local_120);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_118,"gl_FragColor",&local_120);
      local_121 = 1;
      bVar3 = inIoAccessed(this,&local_118);
      local_41e = true;
      if (!bVar3) {
        pool_allocator<char>::pool_allocator(&local_158);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_150,"gl_FragData",&local_158);
        local_159 = 1;
        local_41e = inIoAccessed(this,&local_150);
      }
      local_41d = local_41e;
    }
    if ((local_159 & 1) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_150);
    }
    if ((local_121 & 1) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_118);
    }
    if (local_41d != false) {
      error(this,pTStack_18,"Cannot use gl_FragColor or gl_FragData when using user-defined outputs"
            ,EShLangCount);
    }
    pool_allocator<char>::pool_allocator(&local_190);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_188
               ,"gl_FragColor",&local_190);
    bVar3 = inIoAccessed(this,&local_188);
    b._7_1_ = 0;
    local_420 = false;
    if (bVar3) {
      pool_allocator<char>::pool_allocator(&local_1c0);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_1b8,"gl_FragData",&local_1c0);
      b._7_1_ = 1;
      local_420 = inIoAccessed(this,&local_1b8);
    }
    if ((b._7_1_ & 1) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_1b8);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_188);
    if (local_420 != false) {
      error(this,pTStack_18,"Cannot use both gl_FragColor and gl_FragData",EShLangCount);
    }
    for (local_1d0 = 0; uVar2 = local_1d0,
        sVar7 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::size
                          (&this->xfbBuffers), uVar2 < sVar7; local_1d0 = local_1d0 + 1) {
      pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                         (&this->xfbBuffers,local_1d0);
      if ((pvVar8->contains64BitType & 1U) == 0) {
        pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                           (&this->xfbBuffers,local_1d0);
        if ((pvVar8->contains32BitType & 1U) == 0) {
          pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::
                   operator[](&this->xfbBuffers,local_1d0);
          if ((pvVar8->contains16BitType & 1U) != 0) {
            pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::
                     operator[](&this->xfbBuffers,local_1d0);
            RoundToPow2<unsigned_int>(&pvVar8->implicitStride,2);
          }
        }
        else {
          pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::
                   operator[](&this->xfbBuffers,local_1d0);
          RoundToPow2<unsigned_int>(&pvVar8->implicitStride,4);
        }
      }
      else {
        pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                           (&this->xfbBuffers,local_1d0);
        RoundToPow2<unsigned_int>(&pvVar8->implicitStride,8);
      }
      pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                         (&this->xfbBuffers,local_1d0);
      if (pvVar8->stride != 0x3fff) {
        pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                           (&this->xfbBuffers,local_1d0);
        uVar1 = pvVar8->implicitStride;
        pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                           (&this->xfbBuffers,local_1d0);
        if (pvVar8->stride < uVar1) {
          error(this,pTStack_18,"xfb_stride is too small to hold all buffer entries:",EShLangCount);
          TInfoSinkBase::prefix(&pTStack_18->info,EPrefixError);
          pTVar9 = TInfoSinkBase::operator<<(&pTStack_18->info,"    xfb_buffer ");
          pTVar9 = TInfoSinkBase::operator<<(pTVar9,(uint)local_1d0);
          pTVar9 = TInfoSinkBase::operator<<(pTVar9,", xfb_stride ");
          pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::
                   operator[](&this->xfbBuffers,local_1d0);
          pTVar9 = TInfoSinkBase::operator<<(pTVar9,pvVar8->stride);
          pTVar9 = TInfoSinkBase::operator<<(pTVar9,", minimum stride needed: ");
          pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::
                   operator[](&this->xfbBuffers,local_1d0);
          pTVar9 = TInfoSinkBase::operator<<(pTVar9,pvVar8->implicitStride);
          TInfoSinkBase::operator<<(pTVar9,"\n");
        }
      }
      pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                         (&this->xfbBuffers,local_1d0);
      if (pvVar8->stride == 0x3fff) {
        pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                           (&this->xfbBuffers,local_1d0);
        uVar1 = pvVar8->implicitStride;
        pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                           (&this->xfbBuffers,local_1d0);
        pvVar8->stride = uVar1;
      }
      pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                         (&this->xfbBuffers,local_1d0);
      if ((pvVar8->contains64BitType & 1U) == 0) {
LAB_005fe0ef:
        pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                           (&this->xfbBuffers,local_1d0);
        if ((pvVar8->contains32BitType & 1U) != 0) {
          pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::
                   operator[](&this->xfbBuffers,local_1d0);
          bVar3 = IsMultipleOfPow2<unsigned_int>(pvVar8->stride,4);
          if (!bVar3) {
            error(this,pTStack_18,"xfb_stride must be multiple of 4:",EShLangCount);
            TInfoSinkBase::prefix(&pTStack_18->info,EPrefixError);
            pTVar9 = TInfoSinkBase::operator<<(&pTStack_18->info,"    xfb_buffer ");
            pTVar9 = TInfoSinkBase::operator<<(pTVar9,(uint)local_1d0);
            pTVar9 = TInfoSinkBase::operator<<(pTVar9,", xfb_stride ");
            pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::
                     operator[](&this->xfbBuffers,local_1d0);
            pTVar9 = TInfoSinkBase::operator<<(pTVar9,pvVar8->stride);
            TInfoSinkBase::operator<<(pTVar9,"\n");
            goto LAB_005fe2d0;
          }
        }
        pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                           (&this->xfbBuffers,local_1d0);
        if ((pvVar8->contains16BitType & 1U) != 0) {
          pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::
                   operator[](&this->xfbBuffers,local_1d0);
          bVar3 = IsMultipleOfPow2<unsigned_int>(pvVar8->stride,2);
          if (!bVar3) {
            error(this,pTStack_18,
                  "xfb_stride must be multiple of 2 for buffer holding a half float or 16-bit integer:"
                  ,EShLangCount);
            TInfoSinkBase::prefix(&pTStack_18->info,EPrefixError);
            pTVar9 = TInfoSinkBase::operator<<(&pTStack_18->info,"    xfb_buffer ");
            pTVar9 = TInfoSinkBase::operator<<(pTVar9,(uint)local_1d0);
            pTVar9 = TInfoSinkBase::operator<<(pTVar9,", xfb_stride ");
            pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::
                     operator[](&this->xfbBuffers,local_1d0);
            pTVar9 = TInfoSinkBase::operator<<(pTVar9,pvVar8->stride);
            TInfoSinkBase::operator<<(pTVar9,"\n");
          }
        }
      }
      else {
        pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                           (&this->xfbBuffers,local_1d0);
        bVar3 = IsMultipleOfPow2<unsigned_int>(pvVar8->stride,8);
        if (bVar3) goto LAB_005fe0ef;
        error(this,pTStack_18,
              "xfb_stride must be multiple of 8 for buffer holding a double or 64-bit integer:",
              EShLangCount);
        TInfoSinkBase::prefix(&pTStack_18->info,EPrefixError);
        pTVar9 = TInfoSinkBase::operator<<(&pTStack_18->info,"    xfb_buffer ");
        pTVar9 = TInfoSinkBase::operator<<(pTVar9,(uint)local_1d0);
        pTVar9 = TInfoSinkBase::operator<<(pTVar9,", xfb_stride ");
        pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                           (&this->xfbBuffers,local_1d0);
        pTVar9 = TInfoSinkBase::operator<<(pTVar9,pvVar8->stride);
        TInfoSinkBase::operator<<(pTVar9,"\n");
      }
LAB_005fe2d0:
      pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                         (&this->xfbBuffers,local_1d0);
      uVar1 = pvVar8->stride;
      pTVar10 = MustBeAssigned<TBuiltInResource>::operator->(&this->resources);
      if ((uint)(pTVar10->maxTransformFeedbackInterleavedComponents << 2) < uVar1) {
        error(this,pTStack_18,"xfb_stride is too large:",EShLangCount);
        TInfoSinkBase::prefix(&pTStack_18->info,EPrefixError);
        pTVar9 = TInfoSinkBase::operator<<(&pTStack_18->info,"    xfb_buffer ");
        pTVar9 = TInfoSinkBase::operator<<(pTVar9,(uint)local_1d0);
        pTVar9 = TInfoSinkBase::operator<<(pTVar9,", components (1/4 stride) needed are ");
        pvVar8 = std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::operator[]
                           (&this->xfbBuffers,local_1d0);
        pTVar9 = TInfoSinkBase::operator<<(pTVar9,pvVar8->stride >> 2);
        pTVar9 = TInfoSinkBase::operator<<
                           (pTVar9,", gl_MaxTransformFeedbackInterleavedComponents is ");
        pTVar10 = MustBeAssigned<TBuiltInResource>::operator->(&this->resources);
        pTVar9 = TInfoSinkBase::operator<<
                           (pTVar9,pTVar10->maxTransformFeedbackInterleavedComponents);
        TInfoSinkBase::operator<<(pTVar9,"\n");
      }
    }
    switch(this->language) {
    case EShLangVertex:
      break;
    case EShLangTessControl:
      if (this->vertices == -1) {
        error(this,pTStack_18,"At least one shader must specify an output layout(vertices=...)",
              EShLangCount);
      }
      break;
    case EShLangTessEvaluation:
      EVar4 = getSource(this);
      if (EVar4 == EShSourceGlsl) {
        if (this->inputPrimitive == ElgNone) {
          error(this,pTStack_18,"At least one shader must specify an input layout primitive",
                EShLangCount);
        }
        if (this->vertexSpacing == EvsNone) {
          this->vertexSpacing = EvsEqual;
        }
        if (this->vertexOrder == EvoNone) {
          this->vertexOrder = EvoCcw;
        }
      }
      break;
    case EShLangGeometry:
      if (this->inputPrimitive == ElgNone) {
        error(this,pTStack_18,"At least one shader must specify an input layout primitive",
              EShLangCount);
      }
      if (this->outputPrimitive == ElgNone) {
        error(this,pTStack_18,"At least one shader must specify an output layout primitive",
              EShLangCount);
      }
      if (this->vertices == -1) {
        error(this,pTStack_18,"At least one shader must specify a layout(max_vertices = value)",
              EShLangCount);
      }
      break;
    case EShLangFragment:
      bVar3 = getPostDepthCoverage(this);
      if ((bVar3) && (bVar3 = getEarlyFragmentTests(this), !bVar3)) {
        error(this,pTStack_18,"post_depth_coverage requires early_fragment_tests",EShLangCount);
      }
      break;
    case EShLangCompute:
      sharedBlockCheck(this,pTStack_18);
      break;
    case EShLangRayGen:
    case EShLangIntersect:
    case EShLangAnyHit:
    case EShLangClosestHit:
    case EShLangMiss:
    case EShLangCallable:
      if (1 < this->numShaderRecordBlocks) {
        error(this,pTStack_18,"Only one shaderRecordNV buffer block is allowed per stage",
              EShLangCount);
      }
      break;
    case EShLangMesh:
      pool_allocator<char>::pool_allocator(&local_200);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_1f8,"gl_Position",&local_200);
      bVar3 = inIoAccessed(this,&local_1f8);
      local_231 = 0;
      local_489 = false;
      if (bVar3) {
        pool_allocator<char>::pool_allocator(&local_230);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_228,"gl_PositionPerViewNV",&local_230);
        local_231 = 1;
        local_489 = inIoAccessed(this,&local_228);
      }
      if ((local_231 & 1) != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_228);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_1f8);
      if (local_489 != false) {
        error(this,pTStack_18,"Can only use one of gl_Position or gl_PositionPerViewNV",EShLangCount
             );
      }
      pool_allocator<char>::pool_allocator(&local_268);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_260,"gl_ClipDistance",&local_268);
      bVar3 = inIoAccessed(this,&local_260);
      local_299 = 0;
      local_48b = false;
      if (bVar3) {
        pool_allocator<char>::pool_allocator(&local_298);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_290,"gl_ClipDistancePerViewNV",&local_298);
        local_299 = 1;
        local_48b = inIoAccessed(this,&local_290);
      }
      if ((local_299 & 1) != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_290);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_260);
      if (local_48b != false) {
        error(this,pTStack_18,"Can only use one of gl_ClipDistance or gl_ClipDistancePerViewNV",
              EShLangCount);
      }
      pool_allocator<char>::pool_allocator(&local_2d0);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_2c8,"gl_CullDistance",&local_2d0);
      bVar3 = inIoAccessed(this,&local_2c8);
      local_301 = 0;
      local_48d = false;
      if (bVar3) {
        pool_allocator<char>::pool_allocator(&local_300);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_2f8,"gl_CullDistancePerViewNV",&local_300);
        local_301 = 1;
        local_48d = inIoAccessed(this,&local_2f8);
      }
      if ((local_301 & 1) != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_2f8);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_2c8);
      if (local_48d != false) {
        error(this,pTStack_18,"Can only use one of gl_CullDistance or gl_CullDistancePerViewNV",
              EShLangCount);
      }
      pool_allocator<char>::pool_allocator(&local_338);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_330,"gl_Layer",&local_338);
      bVar3 = inIoAccessed(this,&local_330);
      local_369 = 0;
      local_48f = false;
      if (bVar3) {
        pool_allocator<char>::pool_allocator(&local_368);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_360,"gl_LayerPerViewNV",&local_368);
        local_369 = 1;
        local_48f = inIoAccessed(this,&local_360);
      }
      if ((local_369 & 1) != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_360);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_330);
      if (local_48f != false) {
        error(this,pTStack_18,"Can only use one of gl_Layer or gl_LayerPerViewNV",EShLangCount);
      }
      pool_allocator<char>::pool_allocator(&local_3a0);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_398,"gl_ViewportMask",&local_3a0);
      bVar3 = inIoAccessed(this,&local_398);
      finalLinkTraverser.super_TIntermTraverser.path.
      super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
      super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      local_491 = false;
      if (bVar3) {
        pool_allocator<char>::pool_allocator(&local_3d0);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_3c8,"gl_ViewportMaskPerViewNV",&local_3d0);
        finalLinkTraverser.super_TIntermTraverser.path.
        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        local_491 = inIoAccessed(this,&local_3c8);
      }
      if ((finalLinkTraverser.super_TIntermTraverser.path.
           super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
           super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_3c8);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_398);
      if (local_491 != false) {
        error(this,pTStack_18,"Can only use one of gl_ViewportMask or gl_ViewportMaskPerViewNV",
              EShLangCount);
      }
      if (this->outputPrimitive == ElgNone) {
        error(this,pTStack_18,"At least one shader must specify an output layout primitive",
              EShLangCount);
      }
      if (this->vertices == -1) {
        error(this,pTStack_18,"At least one shader must specify a layout(max_vertices = value)",
              EShLangCount);
      }
      if (this->primitives == -1) {
        error(this,pTStack_18,"At least one shader must specify a layout(max_primitives = value)",
              EShLangCount);
      }
    case EShLangTask:
      if (1 < this->numTaskNVBlocks) {
        error(this,pTStack_18,"Only one taskNV interface block is allowed per shader",EShLangCount);
      }
      if (1 < this->numTaskEXTPayloads) {
        error(this,pTStack_18,
              "Only single variable of type taskPayloadSharedEXT is allowed per shader",EShLangCount
             );
      }
      sharedBlockCheck(this,pTStack_18);
      break;
    default:
      error(this,pTStack_18,"Unknown Stage.",EShLangCount);
    }
    finalCheck::TFinalLinkTraverser::TFinalLinkTraverser((TFinalLinkTraverser *)local_410);
    (*this->treeRoot->_vptr_TIntermNode[2])(this->treeRoot,local_410);
    finalCheck::TFinalLinkTraverser::~TFinalLinkTraverser((TFinalLinkTraverser *)local_410);
  }
  return;
}

Assistant:

void TIntermediate::finalCheck(TInfoSink& infoSink, bool keepUncalled)
{
    if (getTreeRoot() == nullptr)
        return;

    if (numEntryPoints < 1) {
        if (getSource() == EShSourceGlsl)
            error(infoSink, "Missing entry point: Each stage requires one entry point");
        else
            warn(infoSink, "Entry point not found");
    }

    // recursion and missing body checking
    checkCallGraphCycles(infoSink);
    checkCallGraphBodies(infoSink, keepUncalled);

    // overlap/alias/missing I/O, etc.
    inOutLocationCheck(infoSink);

    if (getNumPushConstants() > 1)
        error(infoSink, "Only one push_constant block is allowed per stage");

    // invocations
    if (invocations == TQualifier::layoutNotSet)
        invocations = 1;

    if (inIoAccessed("gl_ClipDistance") && inIoAccessed("gl_ClipVertex"))
        error(infoSink, "Can only use one of gl_ClipDistance or gl_ClipVertex (gl_ClipDistance is preferred)");
    if (inIoAccessed("gl_CullDistance") && inIoAccessed("gl_ClipVertex"))
        error(infoSink, "Can only use one of gl_CullDistance or gl_ClipVertex (gl_ClipDistance is preferred)");

    if (userOutputUsed() && (inIoAccessed("gl_FragColor") || inIoAccessed("gl_FragData")))
        error(infoSink, "Cannot use gl_FragColor or gl_FragData when using user-defined outputs");
    if (inIoAccessed("gl_FragColor") && inIoAccessed("gl_FragData"))
        error(infoSink, "Cannot use both gl_FragColor and gl_FragData");

    for (size_t b = 0; b < xfbBuffers.size(); ++b) {
        if (xfbBuffers[b].contains64BitType)
            RoundToPow2(xfbBuffers[b].implicitStride, 8);
        else if (xfbBuffers[b].contains32BitType)
            RoundToPow2(xfbBuffers[b].implicitStride, 4);
        else if (xfbBuffers[b].contains16BitType)
            RoundToPow2(xfbBuffers[b].implicitStride, 2);

        // "It is a compile-time or link-time error to have
        // any xfb_offset that overflows xfb_stride, whether stated on declarations before or after the xfb_stride, or
        // in different compilation units. While xfb_stride can be declared multiple times for the same buffer, it is a
        // compile-time or link-time error to have different values specified for the stride for the same buffer."
        if (xfbBuffers[b].stride != TQualifier::layoutXfbStrideEnd && xfbBuffers[b].implicitStride > xfbBuffers[b].stride) {
            error(infoSink, "xfb_stride is too small to hold all buffer entries:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << ", minimum stride needed: " << xfbBuffers[b].implicitStride << "\n";
        }
        if (xfbBuffers[b].stride == TQualifier::layoutXfbStrideEnd)
            xfbBuffers[b].stride = xfbBuffers[b].implicitStride;

        // "If the buffer is capturing any
        // outputs with double-precision or 64-bit integer components, the stride must be a multiple of 8, otherwise it must be a
        // multiple of 4, or a compile-time or link-time error results."
        if (xfbBuffers[b].contains64BitType && ! IsMultipleOfPow2(xfbBuffers[b].stride, 8)) {
            error(infoSink, "xfb_stride must be multiple of 8 for buffer holding a double or 64-bit integer:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << "\n";
        } else if (xfbBuffers[b].contains32BitType && ! IsMultipleOfPow2(xfbBuffers[b].stride, 4)) {
            error(infoSink, "xfb_stride must be multiple of 4:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << "\n";
        }
        // "If the buffer is capturing any
        // outputs with half-precision or 16-bit integer components, the stride must be a multiple of 2"
        else if (xfbBuffers[b].contains16BitType && ! IsMultipleOfPow2(xfbBuffers[b].stride, 2)) {
            error(infoSink, "xfb_stride must be multiple of 2 for buffer holding a half float or 16-bit integer:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << "\n";
        }

        // "The resulting stride (implicit or explicit), when divided by 4, must be less than or equal to the
        // implementation-dependent constant gl_MaxTransformFeedbackInterleavedComponents."
        if (xfbBuffers[b].stride > (unsigned int)(4 * resources->maxTransformFeedbackInterleavedComponents)) {
            error(infoSink, "xfb_stride is too large:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", components (1/4 stride) needed are " << xfbBuffers[b].stride/4 << ", gl_MaxTransformFeedbackInterleavedComponents is " << resources->maxTransformFeedbackInterleavedComponents << "\n";
        }
    }

    switch (language) {
    case EShLangVertex:
        break;
    case EShLangTessControl:
        if (vertices == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify an output layout(vertices=...)");
        break;
    case EShLangTessEvaluation:
        if (getSource() == EShSourceGlsl) {
            if (inputPrimitive == ElgNone)
                error(infoSink, "At least one shader must specify an input layout primitive");
            if (vertexSpacing == EvsNone)
                vertexSpacing = EvsEqual;
            if (vertexOrder == EvoNone)
                vertexOrder = EvoCcw;
        }
        break;
    case EShLangGeometry:
        if (inputPrimitive == ElgNone)
            error(infoSink, "At least one shader must specify an input layout primitive");
        if (outputPrimitive == ElgNone)
            error(infoSink, "At least one shader must specify an output layout primitive");
        if (vertices == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify a layout(max_vertices = value)");
        break;
    case EShLangFragment:
        // for GL_ARB_post_depth_coverage, EarlyFragmentTest is set automatically in
        // ParseHelper.cpp. So if we reach here, this must be GL_EXT_post_depth_coverage
        // requiring explicit early_fragment_tests
        if (getPostDepthCoverage() && !getEarlyFragmentTests())
            error(infoSink, "post_depth_coverage requires early_fragment_tests");
        break;
    case EShLangCompute:
        sharedBlockCheck(infoSink);
        break;
    case EShLangRayGen:
    case EShLangIntersect:
    case EShLangAnyHit:
    case EShLangClosestHit:
    case EShLangMiss:
    case EShLangCallable:
        if (numShaderRecordBlocks > 1)
            error(infoSink, "Only one shaderRecordNV buffer block is allowed per stage");
        break;
    case EShLangMesh:
        // NV_mesh_shader doesn't allow use of both single-view and per-view builtins.
        if (inIoAccessed("gl_Position") && inIoAccessed("gl_PositionPerViewNV"))
            error(infoSink, "Can only use one of gl_Position or gl_PositionPerViewNV");
        if (inIoAccessed("gl_ClipDistance") && inIoAccessed("gl_ClipDistancePerViewNV"))
            error(infoSink, "Can only use one of gl_ClipDistance or gl_ClipDistancePerViewNV");
        if (inIoAccessed("gl_CullDistance") && inIoAccessed("gl_CullDistancePerViewNV"))
            error(infoSink, "Can only use one of gl_CullDistance or gl_CullDistancePerViewNV");
        if (inIoAccessed("gl_Layer") && inIoAccessed("gl_LayerPerViewNV"))
            error(infoSink, "Can only use one of gl_Layer or gl_LayerPerViewNV");
        if (inIoAccessed("gl_ViewportMask") && inIoAccessed("gl_ViewportMaskPerViewNV"))
            error(infoSink, "Can only use one of gl_ViewportMask or gl_ViewportMaskPerViewNV");
        if (outputPrimitive == ElgNone)
            error(infoSink, "At least one shader must specify an output layout primitive");
        if (vertices == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify a layout(max_vertices = value)");
        if (primitives == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify a layout(max_primitives = value)");
        [[fallthrough]];
    case EShLangTask:
        if (numTaskNVBlocks > 1)
            error(infoSink, "Only one taskNV interface block is allowed per shader");
        if (numTaskEXTPayloads > 1)
            error(infoSink, "Only single variable of type taskPayloadSharedEXT is allowed per shader");
        sharedBlockCheck(infoSink);
        break;
    default:
        error(infoSink, "Unknown Stage.");
        break;
    }

    // Process the tree for any node-specific work.
    class TFinalLinkTraverser : public TIntermTraverser {
    public:
        TFinalLinkTraverser() { }
        virtual ~TFinalLinkTraverser() { }

        virtual void visitSymbol(TIntermSymbol* symbol)
        {
            // Implicitly size arrays.
            // If an unsized array is left as unsized, it effectively
            // becomes run-time sized.
            symbol->getWritableType().adoptImplicitArraySizes(false);
        }
    } finalLinkTraverser;

    treeRoot->traverse(&finalLinkTraverser);
}